

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator^=(Roaring64Map *this,Roaring64Map *r)

{
  ulong uVar1;
  bool bVar2;
  reference puVar3;
  reference puVar4;
  Roaring64Map *in_RDI;
  iterator r_it_end;
  iterator r_it;
  iterator it_end;
  iterator it;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff38;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff40;
  _Rb_tree_const_iterator<unsigned_long> in_stack_ffffffffffffff48;
  const_iterator __position;
  _Rb_tree_const_iterator<unsigned_long> in_stack_ffffffffffffff50;
  value_type_conflict *in_stack_ffffffffffffff58;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff60;
  Roaring64Map *in_stack_ffffffffffffffb0;
  Roaring64Map *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18 [3];
  
  roaring::Roaring64Map::operator^=(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  local_18[0]._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 (in_stack_ffffffffffffff38);
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 (in_stack_ffffffffffffff38);
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 (in_stack_ffffffffffffff38);
  local_30._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 (in_stack_ffffffffffffff38);
  bVar2 = std::operator==(local_18,&local_20);
  if (bVar2) {
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  else {
    bVar2 = std::operator==(&local_28,&local_30);
    if (!bVar2) {
      puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                         ((_Rb_tree_const_iterator<unsigned_long> *)0x123d66);
      uVar1 = *puVar3;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::rbegin
                (in_stack_ffffffffffffff38);
      puVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_>::operator*
                         ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *)
                          in_stack_ffffffffffffff40);
      bVar2 = true;
      if (uVar1 <= *puVar4) {
        puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                           ((_Rb_tree_const_iterator<unsigned_long> *)0x123db4);
        in_stack_ffffffffffffff60 =
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)*puVar3
        ;
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::rbegin
                  (in_stack_ffffffffffffff38);
        puVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_>::operator*
                           ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_long>_> *)
                            in_stack_ffffffffffffff40);
        bVar2 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                *puVar4 < in_stack_ffffffffffffff60;
      }
      if (bVar2) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                  (in_stack_ffffffffffffff38);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                  (in_stack_ffffffffffffff38);
        std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
        insert<std::_Rb_tree_const_iterator<unsigned_long>>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      else {
        while (bVar2 = std::operator!=(&local_28,&local_30), bVar2) {
          bVar2 = std::operator==(local_18,&local_20);
          if (bVar2) {
            std::_Rb_tree_const_iterator<unsigned_long>::operator*
                      ((_Rb_tree_const_iterator<unsigned_long> *)0x123eaa);
            std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            std::_Rb_tree_const_iterator<unsigned_long>::operator++
                      ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff40);
          }
          else {
            puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                               ((_Rb_tree_const_iterator<unsigned_long> *)0x123edf);
            __position._M_node = (_Base_ptr)*puVar3;
            puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                               ((_Rb_tree_const_iterator<unsigned_long> *)0x123ef4);
            if (__position._M_node == (_Base_ptr)*puVar3) {
              local_18[0]._M_node =
                   (_Base_ptr)
                   std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
                   erase_abi_cxx11_(in_stack_ffffffffffffff40,__position);
              std::_Rb_tree_const_iterator<unsigned_long>::operator++
                        ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff40);
            }
            else {
              puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                                 ((_Rb_tree_const_iterator<unsigned_long> *)0x123f4f);
              in_stack_ffffffffffffff40 =
                   (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   *puVar3;
              puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                                 ((_Rb_tree_const_iterator<unsigned_long> *)0x123f64);
              if (in_stack_ffffffffffffff40 <
                  (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  *puVar3) {
                std::_Rb_tree_const_iterator<unsigned_long>::operator++
                          ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff40);
              }
              else {
                std::_Rb_tree_const_iterator<unsigned_long>::operator*
                          ((_Rb_tree_const_iterator<unsigned_long> *)0x123f9a);
                std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                insert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
                std::_Rb_tree_const_iterator<unsigned_long>::operator++
                          ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff40);
              }
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Roaring64Map &operator^=(const Roaring64Map &r) {
        plain ^= r.plain;

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            check = r.check;
        }  // this empty
        else if (r_it == r_it_end) {
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            check.insert(r.check.begin(), r.check.end());  // obvious disjoint
        } else
            while (r_it != r_it_end) {  // may overlap
                if (it == it_end) {
                    check.insert(*r_it);
                    ++r_it;
                } else if (*it == *r_it) {  // remove overlapping value
                    it = check.erase(it);   // returns *following* iterator
                    ++r_it;
                } else if (*it < *r_it) {
                    ++it;
                }  // keep value from this
                else {
                    check.insert(*r_it);
                    ++r_it;
                }  // add value from r
            }

        return *this;
    }